

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

void __thiscall
clipp::parameter::add_flags<std::__cxx11::string,char_const(&)[7]>
          (parameter *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s1,
          char (*s2) [7])

{
  allocator local_61;
  arg_string local_60;
  arg_string local_40;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->flags_,2);
  std::__cxx11::string::string((string *)&local_40,(string *)s1);
  add_flags(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_60,*s2,&local_61);
  add_flags(this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void
    add_flags(String1&& s1, String2&& s2, Strings&&... ss) {
        flags_.reserve(2 + sizeof...(ss));
        add_flags(std::forward<String1>(s1));
        add_flags(std::forward<String2>(s2), std::forward<Strings>(ss)...);
    }